

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::TracingServiceState_TracingSession
          (TracingServiceState_TracingSession *this,TracingServiceState_TracingSession *param_1)

{
  pointer puVar1;
  int64_t iVar2;
  uint32_t uVar3;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_TracingSession_00407220;
  this->id_ = param_1->id_;
  this->consumer_uid_ = param_1->consumer_uid_;
  ::std::__cxx11::string::string((string *)&this->state_,(string *)&param_1->state_);
  ::std::__cxx11::string::string
            ((string *)&this->unique_session_name_,(string *)&param_1->unique_session_name_);
  puVar1 = (param_1->buffer_size_kb_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->buffer_size_kb_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = param_1->num_data_sources_;
  iVar2 = param_1->start_realtime_ns_;
  this->duration_ms_ = param_1->duration_ms_;
  this->num_data_sources_ = uVar3;
  this->start_realtime_ns_ = iVar2;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TracingServiceState_TracingSession::TracingServiceState_TracingSession(TracingServiceState_TracingSession&&) noexcept = default;